

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_HookCommon.cpp
# Opt level: O0

HookAction axl::spy::hookEnterCommon(HookCommonContext *context,size_t frameBase,size_t originalRet)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t unaff_retaddr;
  HookCommonContext *in_stack_00000008;
  HookAction action;
  ThreadState *threadState;
  HookAction local_30;
  HookAction local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = areHooksEnabled();
  if (bVar1) {
    disableCurrentThreadHooks();
    getCurrentThreadState(context._7_1_);
    if (in_RDI[2] == 0) {
      local_30 = HookAction_Default;
    }
    else {
      local_30 = (*(code *)in_RDI[2])(*in_RDI,in_RDI[1],in_RSI);
    }
    local_2c = local_30;
    if (local_30 == HookAction_Default) {
      if (in_RDI[3] == 0) {
        local_2c = HookAction_JumpTarget;
      }
      else {
        ThreadState::addFrame
                  (threadState,in_stack_00000008,unaff_retaddr,
                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
    enableCurrentThreadHooks();
  }
  else {
    local_2c = HookAction_JumpTarget;
  }
  return local_2c;
}

Assistant:

HookAction
hookEnterCommon(
	HookCommonContext* context,
	size_t frameBase,
	size_t originalRet
) {
	if (!areHooksEnabled())
		return HookAction_JumpTarget;

	disableCurrentThreadHooks();

	ThreadState* threadState = getCurrentThreadState();

	HookAction action = context->m_enterFunc ?
		context->m_enterFunc(context->m_targetFunc, context->m_callbackParam, frameBase) :
		HookAction_Default;

	if (action == HookAction_Default)
		if (!context->m_leaveFunc)
			action = HookAction_JumpTarget;
		else
			threadState->addFrame(context, frameBase, originalRet);

	enableCurrentThreadHooks();
	return action;
}